

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_step(sqlite3_stmt *pStmt)

{
  Mem *p;
  byte *pbVar1;
  int *piVar2;
  char cVar3;
  ushort uVar4;
  undefined2 uVar5;
  sqlite3 *psVar6;
  Btree *p_00;
  Wal *pWVar7;
  uint *puVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  sqlite3_stmt *psVar16;
  ulong uVar17;
  char *pcVar18;
  undefined8 *puVar19;
  size_t sVar20;
  int iVar21;
  ulong uVar22;
  char *pcVar23;
  undefined8 uVar24;
  byte bVar25;
  long lVar26;
  ulong uVar27;
  Mem *pMVar28;
  int iVar29;
  uint uVar30;
  sqlite3 *psVar31;
  u32 uVar32;
  uint uVar33;
  long *plVar34;
  long lVar35;
  bool bVar36;
  StrAccum local_c8;
  uint local_a0;
  int local_9c;
  long local_98;
  Mem *local_90;
  sqlite3 *local_88;
  int local_80;
  int local_7c;
  Mem *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  sqlite3 *local_58;
  sqlite3 *local_50;
  sqlite3_stmt *local_48;
  long local_40;
  sqlite3_stmt *local_38;
  
  iVar10 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar10 == 0) {
    local_50 = *(sqlite3 **)pStmt;
    if (local_50->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(local_50->mutex);
    }
    local_48 = pStmt + 0xb8;
    local_38 = pStmt + 0x88;
    local_9c = 0;
    do {
      psVar31 = *(sqlite3 **)pStmt;
      if (pStmt[199] != (sqlite3_stmt)0x2) {
        while (pStmt[199] == (sqlite3_stmt)0x3) {
          sqlite3_reset(pStmt);
        }
        if (pStmt[199] != (sqlite3_stmt)0x1) goto LAB_00119f72;
        if (((byte)pStmt[200] & 3) == 0) {
          if (psVar31->nVdbeActive == 0) {
            (psVar31->u1).isInterrupted = 0;
          }
          if ((((psVar31->mTrace & 0x82) != 0) && ((psVar31->init).busy == '\0')) &&
             (*(long *)(pStmt + 0xf8) != 0)) {
            sqlite3OsCurrentTimeInt64(psVar31->pVfs,(sqlite3_int64 *)local_48);
          }
          psVar31->nVdbeActive = psVar31->nVdbeActive + 1;
          if (((byte)pStmt[200] & 0x40) == 0) {
            psVar31->nVdbeWrite = psVar31->nVdbeWrite + 1;
          }
          if (((byte)pStmt[200] & 0x80) != 0) {
            psVar31->nVdbeRead = psVar31->nVdbeRead + 1;
          }
          *(undefined4 *)(pStmt + 0x30) = 0;
          pStmt[199] = (sqlite3_stmt)0x2;
          goto LAB_00119f72;
        }
        *(undefined4 *)(pStmt + 0x34) = 0x11;
        uVar11 = 1;
        if ((char)pStmt[0xc6] < '\0') {
          uVar11 = sqlite3VdbeTransferError((Vdbe *)pStmt);
        }
        goto LAB_0011a3f1;
      }
LAB_00119f72:
      if ((*(ushort *)(pStmt + 200) & 0xc) == 0) {
        psVar31->nVdbeExec = psVar31->nVdbeExec + 1;
        uVar11 = sqlite3VdbeExec((Vdbe *)pStmt);
        psVar31->nVdbeExec = psVar31->nVdbeExec + -1;
        uVar33 = uVar11;
        goto LAB_0011a22d;
      }
      psVar6 = *(sqlite3 **)pStmt;
      bVar25 = 1;
      if ((*(ushort *)(pStmt + 200) & 0xc) != 4) {
        bVar25 = *(byte *)((long)&psVar6->flags + 3) & 1;
      }
      local_40 = *(long *)(pStmt + 0x68);
      p = (Mem *)(local_40 + 0x38);
      releaseMemArray(p,8);
      if (*(int *)(pStmt + 0x34) == 7) {
        sqlite3OomFault(psVar6);
LAB_00119fbe:
        uVar11 = 1;
        uVar33 = 1;
        goto LAB_0011a22d;
      }
      if (bVar25 == 0) {
        pMVar28 = (Mem *)0x0;
      }
      else {
        pMVar28 = (Mem *)(*(long *)(pStmt + 0x68) + 0x1f8);
      }
      iVar10 = *(int *)(pStmt + 0x90);
      if (pMVar28 == (Mem *)0x0) {
        uVar27 = 0;
        plVar34 = (long *)0x0;
      }
      else {
        if ((pMVar28->flags & 0x10) == 0) {
          uVar27 = 0;
          plVar34 = (long *)0x0;
        }
        else {
          uVar27 = (ulong)(uint)(pMVar28->n >> 3);
          plVar34 = (long *)pMVar28->z;
        }
        if (0 < (int)uVar27) {
          uVar22 = 0;
          do {
            iVar10 = iVar10 + *(int *)(plVar34[uVar22] + 8);
            uVar22 = uVar22 + 1;
          } while (uVar27 != uVar22);
        }
      }
      iVar14 = *(int *)(pStmt + 0x30);
      iVar12 = iVar14 + 1;
      local_90 = p;
      local_88 = psVar31;
      local_58 = psVar6;
      if (iVar14 < iVar10) {
        uVar30 = *(ushort *)(pStmt + 200) & 0xc;
        uVar33 = 0;
        uVar11 = 0;
        local_a0 = uVar30;
        local_80 = iVar12;
        local_78 = pMVar28;
        iVar29 = iVar14;
        do {
          iVar13 = iVar12;
          iVar12 = iVar29 - *(int *)(pStmt + 0x90);
          psVar16 = local_38;
          iVar14 = iVar29;
          if (*(int *)(pStmt + 0x90) <= iVar29) {
            psVar16 = (sqlite3_stmt *)*plVar34;
            iVar21 = *(int *)(psVar16 + 8);
            iVar14 = iVar12;
            plVar9 = plVar34;
            if (iVar21 <= iVar12) {
              do {
                iVar12 = iVar12 - iVar21;
                psVar16 = (sqlite3_stmt *)plVar9[1];
                iVar21 = *(int *)(psVar16 + 8);
                iVar14 = iVar12;
                plVar9 = plVar9 + 1;
              } while (iVar21 <= iVar12);
            }
          }
          lVar26 = *(long *)psVar16;
          lVar35 = (long)iVar14;
          if ((pMVar28 != (Mem *)0x0) && (*(char *)(lVar26 + 1 + lVar35 * 0x18) == -4)) {
            local_98 = lVar26 + lVar35 * 0x18;
            iVar12 = (int)uVar27;
            if (iVar12 < 1) {
              uVar22 = 0;
            }
            else {
              uVar17 = 0;
              do {
                uVar22 = uVar17;
                if (plVar34[uVar17] == *(long *)(local_98 + 0x10)) break;
                uVar17 = uVar17 + 1;
                uVar22 = uVar27 & 0xffffffff;
              } while ((uVar27 & 0xffffffff) != uVar17);
            }
            bVar36 = true;
            if ((int)uVar22 == iVar12) {
              local_7c = iVar12 * 8 + 8;
              local_70 = uVar27;
              local_68 = lVar35;
              local_60 = lVar26;
              iVar12 = sqlite3VdbeMemGrow(pMVar28,local_7c,(uint)(iVar12 != 0));
              *(int *)(pStmt + 0x34) = iVar12;
              lVar26 = local_60;
              pMVar28 = local_78;
              lVar35 = local_68;
              uVar30 = local_a0;
              if (iVar12 == 0) {
                plVar34 = (long *)local_78->z;
                uVar27 = (ulong)((int)local_70 + 1);
                plVar34[(int)local_70] = *(long *)(local_98 + 0x10);
                uVar5 = local_78->flags;
                local_78->flags = uVar5 & 0xf240 | 0x10;
                local_78->n = local_7c;
                iVar10 = iVar10 + *(int *)(*(long *)(local_98 + 0x10) + 8);
                bVar36 = true;
              }
              else {
                uVar33 = 1;
                uVar11 = 1;
                bVar36 = false;
                uVar27 = local_70;
              }
            }
            iVar12 = iVar13;
            if (!bVar36) goto LAB_0011a214;
          }
          iVar12 = local_80;
          if ((((short)uVar30 != 8) ||
              (cVar3 = *(char *)(lVar26 + lVar35 * 0x18), iVar12 = iVar13, cVar3 == -0x44)) ||
             ((0 < iVar29 && (cVar3 == '\b')))) goto LAB_0011a214;
          iVar12 = iVar13 + 1;
          iVar14 = iVar13;
          iVar29 = iVar13;
        } while (iVar13 < iVar10);
      }
      else {
        lVar26 = 0;
      }
      *(undefined4 *)(pStmt + 0x34) = 0;
      uVar33 = 0x65;
      uVar11 = 0x65;
LAB_0011a214:
      psVar31 = local_88;
      *(int *)(pStmt + 0x30) = iVar12;
      if (uVar11 != 0) goto LAB_0011a22d;
      if ((local_58->u1).isInterrupted != 0) {
        *(undefined4 *)(pStmt + 0x34) = 9;
        sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
        goto LAB_00119fbe;
      }
      local_98 = (long)iVar14;
      pbVar1 = (byte *)(lVar26 + local_98 * 0x18);
      local_c8.db = (sqlite3 *)0x0;
      local_c8.zText = (char *)0x0;
      local_c8.nAlloc = 0;
      local_c8.mxAlloc = 1000000000;
      local_c8.nChar = 0;
      local_c8.accError = '\0';
      local_c8.printfFlags = '\0';
      pcVar18 = "program";
      switch(pbVar1[1]) {
      case 0xf1:
        pcVar18 = *(char **)(*(long *)(pbVar1 + 0x10) + 8);
        goto LAB_0011a755;
      case 0xf2:
        puVar8 = *(uint **)(pbVar1 + 0x10);
        uVar11 = *puVar8;
        if (uVar11 != 0) {
          uVar27 = 1;
          do {
            uVar24 = 0x2c;
            if ((int)uVar27 == 1) {
              uVar24 = 0x5b;
            }
            sqlite3_str_appendf(&local_c8,"%c%u",uVar24,(ulong)puVar8[uVar27]);
            uVar33 = (int)uVar27 + 1;
            uVar27 = (ulong)uVar33;
          } while (uVar33 <= uVar11);
        }
        if (local_c8.nChar + 1 < local_c8.nAlloc) {
          local_c8.zText[local_c8.nChar] = ']';
          psVar31 = local_88;
          local_c8.nChar = local_c8.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_c8,"]",1);
          psVar31 = local_88;
        }
        goto LAB_0011a7bc;
      case 0xf3:
        puVar19 = *(undefined8 **)(pbVar1 + 0x10);
LAB_0011a713:
        uVar24 = *puVar19;
        pcVar18 = "%lld";
        goto LAB_0011a722;
      case 0xf4:
        puVar19 = *(undefined8 **)(pbVar1 + 0x10);
LAB_0011a72f:
        sqlite3_str_appendf(&local_c8,"%.16g",(int)*puVar19);
        goto LAB_0011a76f;
      case 0xf5:
        uVar24 = *(undefined8 *)(*(long *)(pbVar1 + 0x10) + 0x10);
        pcVar18 = "vtab:%p";
LAB_0011a722:
        sqlite3_str_appendf(&local_c8,pcVar18,uVar24);
        goto LAB_0011a76f;
      case 0xf6:
        puVar19 = *(undefined8 **)(pbVar1 + 0x10);
        uVar4 = *(ushort *)((long)puVar19 + 0x14);
        if ((uVar4 & 2) == 0) {
          if ((uVar4 & 0x24) != 0) goto LAB_0011a713;
          if ((uVar4 & 8) != 0) goto LAB_0011a72f;
          pcVar18 = "NULL";
          if ((uVar4 & 1) == 0) {
            pcVar18 = "(blob)";
          }
        }
        else {
          pcVar18 = (char *)puVar19[1];
        }
        break;
      default:
        pcVar18 = *(char **)(pbVar1 + 0x10);
        break;
      case 0xf8:
        lVar26 = *(long *)(pbVar1 + 0x10);
        sqlite3_str_appendf(&local_c8,"k(%d",(ulong)*(ushort *)(lVar26 + 6));
        if (*(short *)(lVar26 + 6) != 0) {
          uVar27 = 0;
          do {
            puVar19 = *(undefined8 **)(lVar26 + 0x20 + uVar27 * 8);
            pcVar18 = "";
            if (puVar19 != (undefined8 *)0x0) {
              pcVar18 = (char *)*puVar19;
            }
            strcmp(pcVar18,"BINARY");
            bVar25 = *(byte *)(*(long *)(lVar26 + 0x18) + uVar27);
            pcVar18 = "-";
            if ((bVar25 & 1) == 0) {
              pcVar18 = "";
            }
            pcVar23 = "N.";
            if ((bVar25 & 2) == 0) {
              pcVar23 = "";
            }
            sqlite3_str_appendf(&local_c8,",%s%s%s",pcVar18,pcVar23);
            uVar27 = uVar27 + 1;
          } while (uVar27 < *(ushort *)(lVar26 + 6));
        }
        if (local_c8.nChar + 1 < local_c8.nAlloc) {
          local_c8.zText[local_c8.nChar] = ')';
          local_c8.nChar = local_c8.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_c8,")",1);
        }
LAB_0011a7bc:
        pcVar18 = (char *)0x0;
        break;
      case 0xf9:
        pcVar18 = *(char **)(pbVar1 + 0x10);
LAB_0011a755:
        sqlite3_str_appendf(&local_c8,"%s(%d)",*(undefined8 *)(pcVar18 + 0x38),
                            (ulong)(uint)(int)*pcVar18);
        goto LAB_0011a76f;
      case 0xfb:
        pcVar18 = (char *)**(undefined8 **)(pbVar1 + 0x10);
        break;
      case 0xfc:
        break;
      case 0xfd:
        sqlite3_str_appendf(&local_c8,"%d",(ulong)*(uint *)(pbVar1 + 0x10));
        goto LAB_0011a76f;
      case 0xfe:
        sqlite3_str_appendf(&local_c8,"%.18s-%s",**(undefined8 **)(pbVar1 + 0x10),
                            sqlite3VdbeDisplayP4_encnames_rel +
                            *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                    (ulong)*(byte *)(*(undefined8 **)(pbVar1 + 0x10) + 1) * 4));
LAB_0011a76f:
        pcVar18 = (char *)0x0;
      }
      if (pcVar18 != (char *)0x0) {
        sVar20 = strlen(pcVar18);
        sqlite3_str_append(&local_c8,pcVar18,(uint)sVar20 & 0x3fffffff);
      }
      lVar26 = local_40;
      psVar6 = local_58;
      if ((local_c8._28_2_ & 7) != 0) {
        sqlite3OomFault(local_58);
      }
      pcVar18 = sqlite3StrAccumFinish(&local_c8);
      if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
        if ((*(byte *)(lVar26 + 0x4d) & 0x90) == 0) {
          *(long *)(lVar26 + 0x38) = (long)*(int *)(pbVar1 + 4);
          *(undefined2 *)(lVar26 + 0x4c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64(local_90,(long)*(int *)(pbVar1 + 4));
        }
        if ((*(byte *)(lVar26 + 0x85) & 0x90) == 0) {
          *(long *)(lVar26 + 0x70) = (long)*(int *)(pbVar1 + 8);
          *(undefined2 *)(lVar26 + 0x84) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0x70),(long)*(int *)(pbVar1 + 8));
        }
        if ((*(byte *)(lVar26 + 0xbd) & 0x90) == 0) {
          *(long *)(lVar26 + 0xa8) = (long)*(int *)(pbVar1 + 0xc);
          *(undefined2 *)(lVar26 + 0xbc) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0xa8),(long)*(int *)(pbVar1 + 0xc));
        }
        lVar35 = 0xe0;
      }
      else {
        if ((*(byte *)(lVar26 + 0x4d) & 0x90) == 0) {
          *(long *)(lVar26 + 0x38) = local_98;
          *(undefined2 *)(lVar26 + 0x4c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64(local_90,local_98);
        }
        sqlite3VdbeMemSetStr
                  ((Mem *)(lVar26 + 0x70),
                   sqlite3OpcodeName_azName_rel +
                   *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*pbVar1 * 4),-1,'\x01',
                   (_func_void_void_ptr *)0x0);
        if ((*(byte *)(lVar26 + 0xbd) & 0x90) == 0) {
          *(long *)(lVar26 + 0xa8) = (long)*(int *)(pbVar1 + 4);
          *(undefined2 *)(lVar26 + 0xbc) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0xa8),(long)*(int *)(pbVar1 + 4));
        }
        if ((*(byte *)(lVar26 + 0xf5) & 0x90) == 0) {
          *(long *)(lVar26 + 0xe0) = (long)*(int *)(pbVar1 + 8);
          *(undefined2 *)(lVar26 + 0xf4) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0xe0),(long)*(int *)(pbVar1 + 8));
        }
        if ((*(byte *)(lVar26 + 0x12d) & 0x90) == 0) {
          *(long *)(lVar26 + 0x118) = (long)*(int *)(pbVar1 + 0xc);
          *(undefined2 *)(lVar26 + 300) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0x118),(long)*(int *)(pbVar1 + 0xc));
        }
        if ((*(byte *)(lVar26 + 0x19d) & 0x90) == 0) {
          *(ulong *)(lVar26 + 0x188) = (ulong)*(ushort *)(pbVar1 + 2);
          *(undefined2 *)(lVar26 + 0x19c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar26 + 0x188),(ulong)*(ushort *)(pbVar1 + 2));
        }
        if ((*(byte *)(lVar26 + 0x1d5) & 0x90) == 0) {
          *(undefined2 *)(lVar26 + 0x1d4) = 1;
        }
        else {
          vdbeMemClearExternAndSetNull((Mem *)(lVar26 + 0x1c0));
        }
        lVar35 = 0x150;
      }
      sqlite3VdbeMemSetStr((Mem *)(lVar26 + lVar35),pcVar18,-1,'\x01',sqlite3_free);
      *(Mem **)(pStmt + 0xa0) = local_90;
      bVar36 = psVar6->mallocFailed == '\0';
      uVar15 = 7;
      if (bVar36) {
        uVar15 = 0;
      }
      uVar11 = 1;
      if (bVar36) {
        uVar11 = 100;
      }
      *(undefined4 *)(pStmt + 0x34) = uVar15;
      uVar33 = uVar11;
LAB_0011a22d:
      if (uVar11 == 100) {
        psVar31->errCode = 100;
        uVar11 = 100;
      }
      else {
        if (0 < *(long *)(pStmt + 0xb8)) {
          invokeProfileCallback(psVar31,(Vdbe *)pStmt);
        }
        *(undefined8 *)(pStmt + 0xa0) = 0;
        if (uVar11 == 0x65) {
          if (psVar31->autoCommit == '\0') {
            uVar11 = 0x65;
            uVar33 = 0x65;
          }
          else {
            if (psVar31->nDb < 1) {
              iVar10 = 0;
            }
            else {
              lVar35 = 0;
              lVar26 = 0;
              iVar10 = 0;
              do {
                p_00 = *(Btree **)((long)&psVar31->aDb->pBt + lVar35);
                if (p_00 != (Btree *)0x0) {
                  if ((p_00->sharable != '\0') &&
                     (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                    btreeLockCarefully(p_00);
                  }
                  pWVar7 = p_00->pBt->pPager->pWal;
                  if (pWVar7 == (Wal *)0x0) {
                    uVar32 = 0;
                  }
                  else {
                    uVar32 = pWVar7->iCallback;
                    pWVar7->iCallback = 0;
                  }
                  if (p_00->sharable != '\0') {
                    piVar2 = &p_00->wantToLock;
                    *piVar2 = *piVar2 + -1;
                    if (*piVar2 == 0) {
                      unlockBtreeMutex(p_00);
                    }
                  }
                  if (((0 < (int)uVar32) &&
                      (psVar31->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0))
                     && (iVar10 == 0)) {
                    iVar10 = (*psVar31->xWalCallback)
                                       (psVar31->pWalArg,psVar31,
                                        *(char **)((long)&psVar31->aDb->zDbSName + lVar35),uVar32);
                  }
                }
                lVar26 = lVar26 + 1;
                lVar35 = lVar35 + 0x20;
              } while (lVar26 < psVar31->nDb);
            }
            *(int *)(pStmt + 0x34) = iVar10;
            uVar11 = 1;
            uVar33 = uVar11;
            if (iVar10 == 0) {
              uVar11 = 0x65;
              uVar33 = 0x65;
            }
          }
        }
        else if ((char)pStmt[0xc6] < '\0') {
          uVar11 = sqlite3VdbeTransferError((Vdbe *)pStmt);
          uVar33 = uVar11;
        }
        psVar31->errCode = uVar11;
        if (((*(int *)(pStmt + 0x34) != 0) || ((*(sqlite3 **)pStmt)->mallocFailed != '\0')) &&
           ((iVar10 = apiHandleError(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34)), iVar10 == 7 &&
            (*(undefined4 *)(pStmt + 0x34) = 7, uVar11 = uVar33, (char)pStmt[0xc6] < '\0')))) {
          uVar11 = 7;
        }
LAB_0011a3f1:
        uVar11 = uVar11 & psVar31->errMask;
      }
      if (uVar11 != 0x11) break;
      if (local_9c == 0x32) {
        uVar11 = 0x11;
        break;
      }
      iVar10 = *(int *)(pStmt + 0x30);
      iVar14 = sqlite3Reprepare((Vdbe *)pStmt);
      psVar31 = local_50;
      if (iVar14 == 0) {
        sqlite3_reset(pStmt);
        uVar11 = 0;
        if (-1 < iVar10) {
          pStmt[0xc5] = (sqlite3_stmt)0xfe;
        }
      }
      else {
        pcVar18 = (char *)sqlite3ValueText(local_50->pErr,'\x01');
        if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
          sqlite3DbFreeNN(psVar31,*(void **)(pStmt + 0xa8));
        }
        if (psVar31->mallocFailed == '\0') {
          pcVar18 = sqlite3DbStrDup(psVar31,pcVar18);
          *(char **)(pStmt + 0xa8) = pcVar18;
          uVar11 = apiHandleError(psVar31,iVar14);
          *(uint *)(pStmt + 0x34) = uVar11;
        }
        else {
          *(undefined8 *)(pStmt + 0xa8) = 0;
          *(undefined4 *)(pStmt + 0x34) = 7;
          uVar11 = 7;
        }
      }
      local_9c = local_9c + 1;
    } while (iVar14 == 0);
    if (local_50->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(local_50->mutex);
    }
  }
  else {
    uVar11 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1648f,
                "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
  }
  return uVar11;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}